

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O3

SUNNonlinearSolver SUNNonlinSol_FixedPoint(N_Vector y,int m,SUNContext_conflict sunctx)

{
  SUNNonlinearSolver_Ops p_Var1;
  SUNNonlinearSolver p_Var2;
  void *pvVar3;
  undefined8 uVar4;
  void *pvVar5;
  size_t __size;
  int m_1;
  
  p_Var2 = (SUNNonlinearSolver)SUNNonlinSolNewEmpty(sunctx);
  p_Var1 = p_Var2->ops;
  p_Var1->gettype = SUNNonlinSolGetType_FixedPoint;
  p_Var1->initialize = SUNNonlinSolInitialize_FixedPoint;
  p_Var1->solve = SUNNonlinSolSolve_FixedPoint;
  p_Var1->free = SUNNonlinSolFree_FixedPoint;
  p_Var1->setsysfn = SUNNonlinSolSetSysFn_FixedPoint;
  p_Var1->setctestfn = SUNNonlinSolSetConvTestFn_FixedPoint;
  p_Var1->setmaxiters = SUNNonlinSolSetMaxIters_FixedPoint;
  p_Var1->getnumiters = SUNNonlinSolGetNumIters_FixedPoint;
  p_Var1->getcuriter = SUNNonlinSolGetCurIter_FixedPoint;
  p_Var1->getnumconvfails = SUNNonlinSolGetNumConvFails_FixedPoint;
  pvVar3 = calloc(1,0xb0);
  p_Var2->content = pvVar3;
  *(int *)((long)pvVar3 + 0x10) = m;
  *(undefined8 *)((long)pvVar3 + 0x28) = 0x3ff0000000000000;
  *(undefined4 *)((long)pvVar3 + 0x94) = 3;
  uVar4 = N_VClone(y);
  *(undefined8 *)((long)p_Var2->content + 0x68) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)((long)p_Var2->content + 0x70) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)((long)p_Var2->content + 0x88) = uVar4;
  if (0 < m) {
    uVar4 = N_VClone(y);
    *(undefined8 *)((long)p_Var2->content + 0x78) = uVar4;
    uVar4 = N_VClone(y);
    pvVar3 = p_Var2->content;
    *(undefined8 *)((long)pvVar3 + 0x80) = uVar4;
    pvVar5 = malloc((ulong)(uint)m * 4);
    *(void **)((long)pvVar3 + 0x18) = pvVar5;
    pvVar5 = malloc((ulong)(uint)(m * m) << 3);
    *(void **)((long)pvVar3 + 0x30) = pvVar5;
    pvVar5 = malloc((ulong)(uint)m << 3);
    *(void **)((long)pvVar3 + 0x38) = pvVar5;
    __size = (ulong)(m * 2 + 2) << 3;
    pvVar5 = malloc(__size);
    *(void **)((long)pvVar3 + 0x40) = pvVar5;
    uVar4 = N_VCloneVectorArray(m,y);
    *(undefined8 *)((long)p_Var2->content + 0x48) = uVar4;
    uVar4 = N_VCloneVectorArray(m,y);
    *(undefined8 *)((long)p_Var2->content + 0x50) = uVar4;
    uVar4 = N_VCloneVectorArray(m,y);
    pvVar3 = p_Var2->content;
    *(undefined8 *)((long)pvVar3 + 0x58) = uVar4;
    pvVar5 = malloc(__size);
    *(void **)((long)pvVar3 + 0x60) = pvVar5;
  }
  return p_Var2;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_FixedPoint(N_Vector y, int m, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNNonlinearSolver NLS                       = NULL;
  SUNNonlinearSolverContent_FixedPoint content = NULL;

  /* Check that the supplied N_Vector supports all required operations */
  SUNAssertNull(y->ops->nvclone && y->ops->nvdestroy && y->ops->nvscale &&
                  y->ops->nvlinearsum && y->ops->nvdotprod,
                SUN_ERR_ARG_INCOMPATIBLE);

  /* Create nonlinear linear solver */
  NLS = SUNNonlinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  NLS->ops->gettype         = SUNNonlinSolGetType_FixedPoint;
  NLS->ops->initialize      = SUNNonlinSolInitialize_FixedPoint;
  NLS->ops->solve           = SUNNonlinSolSolve_FixedPoint;
  NLS->ops->free            = SUNNonlinSolFree_FixedPoint;
  NLS->ops->setsysfn        = SUNNonlinSolSetSysFn_FixedPoint;
  NLS->ops->setctestfn      = SUNNonlinSolSetConvTestFn_FixedPoint;
  NLS->ops->setmaxiters     = SUNNonlinSolSetMaxIters_FixedPoint;
  NLS->ops->getnumiters     = SUNNonlinSolGetNumIters_FixedPoint;
  NLS->ops->getcuriter      = SUNNonlinSolGetCurIter_FixedPoint;
  NLS->ops->getnumconvfails = SUNNonlinSolGetNumConvFails_FixedPoint;

  /* Create nonlinear solver content structure */
  content = NULL;
  content = (SUNNonlinearSolverContent_FixedPoint)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Initialize all components of content to 0/NULL */
  memset(content, 0, sizeof(struct _SUNNonlinearSolverContent_FixedPoint));

  /* Attach content */
  NLS->content = content;

  /* Fill general content */
  content->Sys        = NULL;
  content->CTest      = NULL;
  content->m          = m;
  content->damping    = SUNFALSE;
  content->beta       = ONE;
  content->curiter    = 0;
  content->maxiters   = 3;
  content->niters     = 0;
  content->nconvfails = 0;
  content->ctest_data = NULL;

  /* Fill allocatable content */
  SUNCheckCallNull(AllocateContent(NLS, y));

  return (NLS);
}